

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O2

void __thiscall sf2cute::RIFFListChunk::~RIFFListChunk(RIFFListChunk *this)

{
  (this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface =
       (_func_int **)&PTR__RIFFListChunk_0011d9f8;
  std::
  vector<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ::~vector(&this->subchunks_);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~RIFFListChunk() = default;